

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jacobi.h
# Opt level: O0

void Eigen::internal::
     apply_rotation_in_the_plane<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>,Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>,float>
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_> *xpr_x,
               DenseBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_> *xpr_y,
               JacobiRotation<float> *j)

{
  Index IVar1;
  Index IVar2;
  BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true> *pBVar3;
  Index incrx_00;
  Index incry_00;
  Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false> *pBVar4;
  ScalarWithConstIfNotLvalue *x_00;
  ScalarWithConstIfNotLvalue *y_00;
  void *extraout_RDX;
  void *pvVar5;
  float c_00;
  float s_00;
  float s;
  float c;
  Scalar *y;
  Scalar *x;
  Index incry;
  Index incrx;
  Index size;
  bool Vectorizable;
  JacobiRotation<float> *j_local;
  DenseBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_> *xpr_y_local;
  DenseBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_> *xpr_x_local;
  
  IVar1 = EigenBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_>::size
                    ((EigenBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
                     xpr_x);
  IVar2 = EigenBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_>::size
                    ((EigenBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
                     xpr_y);
  if (IVar1 != IVar2) {
    __assert_fail("xpr_x.size() == xpr_y.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Jacobi/Jacobi.h"
                  ,0x1cb,
                  "void Eigen::internal::apply_rotation_in_the_plane(DenseBase<VectorX> &, DenseBase<VectorY> &, const JacobiRotation<OtherScalar> &) [VectorX = Eigen::Block<Eigen::Matrix<float, 3, 3>, 1, 3>, VectorY = Eigen::Block<Eigen::Matrix<float, 3, 3>, 1, 3>, OtherScalar = float]"
                 );
  }
  IVar1 = EigenBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_>::size
                    ((EigenBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
                     xpr_x);
  pBVar3 = (BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true> *)
           EigenBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_>::derived
                     ((EigenBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
                      xpr_x);
  incrx_00 = BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true>::innerStride
                       (pBVar3);
  pBVar3 = (BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true> *)
           EigenBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_>::derived
                     ((EigenBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
                      xpr_y);
  incry_00 = BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true>::innerStride
                       (pBVar3);
  pBVar4 = EigenBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_>::derived
                     ((EigenBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
                      xpr_x);
  x_00 = MapBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>::coeffRef
                   ((MapBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>,_1> *)
                    pBVar4,0);
  pBVar4 = EigenBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_>::derived
                     ((EigenBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
                      xpr_y);
  pvVar5 = (void *)0x0;
  y_00 = MapBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>::coeffRef
                   ((MapBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>,_1> *)
                    pBVar4,0);
  JacobiRotation<float>::c(j,pvVar5,extraout_RDX);
  s_00 = JacobiRotation<float>::s(j);
  if ((((c_00 != 1.0) || (NAN(c_00))) || (s_00 != 0.0)) || (NAN(s_00))) {
    apply_rotation_in_the_plane_selector<float,_float,_3,_0,_false>::run
              (x_00,incrx_00,y_00,incry_00,IVar1,c_00,s_00);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
void /*EIGEN_DONT_INLINE*/ apply_rotation_in_the_plane(DenseBase<VectorX>& xpr_x, DenseBase<VectorY>& xpr_y, const JacobiRotation<OtherScalar>& j)
{
  typedef typename VectorX::Scalar Scalar;
  const bool Vectorizable =    (int(VectorX::Flags) & int(VectorY::Flags) & PacketAccessBit)
                            && (int(packet_traits<Scalar>::size) == int(packet_traits<OtherScalar>::size));

  eigen_assert(xpr_x.size() == xpr_y.size());
  Index size = xpr_x.size();
  Index incrx = xpr_x.derived().innerStride();
  Index incry = xpr_y.derived().innerStride();

  Scalar* EIGEN_RESTRICT x = &xpr_x.derived().coeffRef(0);
  Scalar* EIGEN_RESTRICT y = &xpr_y.derived().coeffRef(0);

  OtherScalar c = j.c();
  OtherScalar s = j.s();
  if (c==OtherScalar(1) && s==OtherScalar(0))
    return;

  apply_rotation_in_the_plane_selector<
    Scalar,OtherScalar,
    VectorX::SizeAtCompileTime,
    EIGEN_PLAIN_ENUM_MIN(evaluator<VectorX>::Alignment, evaluator<VectorY>::Alignment),
    Vectorizable>::run(x,incrx,y,incry,size,c,s);
}